

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>::
     deserialize<InputStream>
               (shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *opt,
               InputStream *istream)

{
  uint8_t discriminator;
  shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *in_stack_ffffffffffffffd8;
  __shared_ptr_access<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffe0;
  undefined1 local_11;
  
  deserialize<unsigned_char,InputStream>
            ((uchar *)in_stack_ffffffffffffffe0,(InputStream *)in_stack_ffffffffffffffd8);
  if (local_11 == '\0') {
    std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>::shared_ptr
              ((shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *)0x19d65f);
    std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>::operator=
              ((shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *)
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>::~shared_ptr
              ((shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *)0x19d674);
  }
  else {
    BuiltinDeserializer<std::shared_ptr<std::unique_ptr<int,std::default_delete<int>>>,void>::
    make_nonempty<std::shared_ptr<std::unique_ptr<int,std::default_delete<int>>>>
              ((shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *)
               in_stack_ffffffffffffffe0);
    std::
    __shared_ptr_access<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_stack_ffffffffffffffe0);
    deserialize<std::unique_ptr<int,std::default_delete<int>>,InputStream>
              ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_ffffffffffffffe0,
               (InputStream *)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }